

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

bool __thiscall IDLExport::save(IDLExport *this,ostream *stream,RegistryIterator *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  const_iterator cVar5;
  long *plVar6;
  iterator iVar7;
  UnsupportedType *this_00;
  long lVar8;
  Type *pTVar9;
  ostream *poVar10;
  mapped_type *this_01;
  size_type *psVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ios_base *this_02;
  long *plVar14;
  _Alloc_hider _Var15;
  string base_name;
  string def;
  string type_namespace;
  ostringstream stream_1;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  long *local_340;
  size_t local_338;
  long local_330;
  long lStack_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  long *local_300;
  size_t local_2f8;
  long local_2f0;
  long lStack_2e8;
  long *local_2e0;
  size_t local_2d8;
  long local_2d0;
  long lStack_2c8;
  undefined1 *local_2c0;
  size_t local_2b8;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0;
  size_t local_298;
  undefined1 local_290 [16];
  undefined1 *local_280;
  size_t local_278;
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 local_200 [112];
  ios_base local_190 [16];
  ios_base local_180 [264];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
  *local_38;
  
  if ((this->m_selected_types)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    Typelib::Type::getName_abi_cxx11_();
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->m_selected_types)._M_t,(key_type *)local_200);
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_);
    }
    if ((_Rb_tree_header *)cVar5._M_node ==
        &(this->m_selected_types)._M_t._M_impl.super__Rb_tree_header) {
      return false;
    }
  }
  bVar2 = Typelib::RegistryIterator::isAlias(type);
  if (!bVar2) {
    if ((this->m_blob_threshold != 0) &&
       (iVar4 = Typelib::Type::getSize(), this->m_blob_threshold < iVar4)) {
      Typelib::getNamespace((string *)&local_360);
      anon_unknown.dwarf_19656::getIDLAbsoluteNamespace
                ((string *)local_200,(anon_unknown_dwarf_19656 *)local_360._M_dataplus._M_p,
                 (string *)local_360._M_string_length,this);
      paVar1 = &local_360.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != paVar1) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      anon_unknown.dwarf_19656::nameSplit
                ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_360,(string *)local_200);
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_360);
      local_360._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct
                ((ulong)&local_360,(char)(local_360.field_2._M_allocated_capacity << 2));
      adaptNamespace(this,stream,(string *)local_200);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (stream,local_360._M_dataplus._M_p,local_360._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"typedef sequence<octet> ",0x18);
      Typelib::Type::getBasename_abi_cxx11_();
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != paVar1) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_);
      }
      return true;
    }
    local_200._0_8_ = &PTR_visit__0011d8a0;
    local_200._8_8_ = this;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_200 + 0x10));
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_38 = &this->m_exported_typedefs;
    Typelib::Type::getNamespace_abi_cxx11_();
    anon_unknown.dwarf_19656::getIDLAbsoluteNamespace
              (&local_360,(anon_unknown_dwarf_19656 *)local_3a0._M_dataplus._M_p,
               (string *)local_3a0._M_string_length,(IDLExport *)local_200._8_8_);
    anon_unknown.dwarf_19656::IDLExportVisitor::setTargetNamespace
              ((IDLExportVisitor *)local_200,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    paVar1 = &local_3a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    Typelib::TypeVisitor::apply((Type *)local_200);
    std::__cxx11::stringbuf::str();
    bVar2 = (IDLExport *)local_360._M_string_length != (IDLExport *)0x0;
    if (bVar2) {
      local_3a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a0,local_58._M_p,local_58._M_p + local_50);
      adaptNamespace(this,stream,&local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a0._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (stream,local_360._M_dataplus._M_p,local_360._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    local_200._0_8_ = &PTR_visit__0011d8a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_200 + 0x10));
    this_02 = local_180;
    goto LAB_0010ebae;
  }
  Typelib::Type::getNamespace_abi_cxx11_();
  Typelib::getNamespace((string *)&local_360);
  bVar2 = true;
  if ((local_200._8_8_ == local_360._M_string_length) &&
     (((IDLExport *)local_200._8_8_ == (IDLExport *)0x0 ||
      (iVar4 = bcmp((void *)local_200._0_8_,local_360._M_dataplus._M_p,local_200._8_8_), iVar4 == 0)
      ))) {
    Typelib::Type::getBasename_abi_cxx11_();
    Typelib::getTypename((string *)&local_320);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x11813d);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_380.field_2._M_allocated_capacity = *psVar11;
      local_380.field_2._8_8_ = plVar6[3];
    }
    else {
      local_380.field_2._M_allocated_capacity = *psVar11;
      local_380._M_dataplus._M_p = (pointer)*plVar6;
    }
    _Var15._M_p = local_380._M_dataplus._M_p;
    local_380._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((local_3a0._M_string_length == local_380._M_string_length) &&
       (((string *)local_3a0._M_string_length == (string *)0x0 ||
        (iVar4 = bcmp(local_3a0._M_dataplus._M_p,local_380._M_dataplus._M_p,
                      local_3a0._M_string_length), iVar4 == 0)))) {
      bVar2 = false;
    }
    else {
      Typelib::Type::getBasename_abi_cxx11_();
      Typelib::getTypename((string *)local_220);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_220,0,(char *)0x0,0x118145);
      local_340 = &local_330;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_330 = *plVar12;
        lStack_328 = plVar6[3];
      }
      else {
        local_330 = *plVar12;
        local_340 = (long *)*plVar6;
      }
      plVar14 = local_340;
      local_338 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((local_278 == local_338) &&
         ((local_278 == 0 || (iVar4 = bcmp(local_280,local_340,local_278), iVar4 == 0)))) {
        bVar2 = false;
      }
      else {
        Typelib::getTypename((string *)&local_2a0);
        Typelib::Type::getBasename_abi_cxx11_();
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_240,0,(char *)0x0,0x11813d);
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_2f0 = *plVar12;
          lStack_2e8 = plVar6[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *plVar12;
          local_300 = (long *)*plVar6;
        }
        plVar14 = local_300;
        local_2f8 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((local_298 == local_2f8) &&
           ((local_298 == 0 || (iVar4 = bcmp(local_2a0,local_300,local_298), iVar4 == 0)))) {
          bVar2 = false;
        }
        else {
          Typelib::getTypename((string *)&local_2c0);
          Typelib::Type::getBasename_abi_cxx11_();
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_260,0,(char *)0x0,0x118145);
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_2d0 = *plVar12;
            lStack_2c8 = plVar6[3];
            local_2e0 = &local_2d0;
          }
          else {
            local_2d0 = *plVar12;
            local_2e0 = (long *)*plVar6;
          }
          plVar14 = local_2e0;
          local_2d8 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if (local_2b8 == local_2d8) {
            if (local_2b8 == 0) {
              bVar2 = false;
            }
            else {
              iVar4 = bcmp(local_2c0,local_2e0,local_2b8);
              bVar2 = iVar4 != 0;
            }
          }
          else {
            bVar2 = true;
          }
          if (plVar14 != &local_2d0) {
            operator_delete(plVar14);
          }
          if (local_260[0] != local_250) {
            operator_delete(local_260[0]);
          }
          plVar14 = local_300;
          if (local_2c0 != local_2b0) {
            operator_delete(local_2c0);
            plVar14 = local_300;
          }
        }
        if (plVar14 != &local_2f0) {
          operator_delete(plVar14);
        }
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        plVar14 = local_340;
        if (local_2a0 != local_290) {
          operator_delete(local_2a0);
          plVar14 = local_340;
        }
      }
      if (plVar14 != &local_330) {
        operator_delete(plVar14);
      }
      if (local_220[0] != local_210) {
        operator_delete(local_220[0]);
      }
      _Var15._M_p = local_380._M_dataplus._M_p;
      if (local_280 != local_270) {
        operator_delete(local_280);
        _Var15._M_p = local_380._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var15._M_p != &local_380.field_2) {
      operator_delete(_Var15._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
    operator_delete((void *)local_200._0_8_);
  }
  if (!bVar2) {
    return false;
  }
  checkType(*(Type **)(*(long *)(type + 8) + 0x40));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  Typelib::getNamespace((string *)&local_3a0);
  anon_unknown.dwarf_19656::getIDLAbsoluteNamespace
            (&local_360,(anon_unknown_dwarf_19656 *)local_3a0._M_dataplus._M_p,
             (string *)local_3a0._M_string_length,this);
  paVar1 = &local_3a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  lVar8 = *(long *)(*(long *)(type + 8) + 0x20);
  local_3a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a0,lVar8,*(long *)(*(long *)(type + 8) + 0x28) + lVar8);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
          ::find(&(this->m_exported_typedefs)._M_t,&local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar7._M_node ==
      &(this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header) {
    Typelib::getTypename((string *)&local_3a0);
    lVar8 = std::__cxx11::string::find_first_of((char *)&local_3a0,0x11817e,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    if (lVar8 != -1) goto LAB_0010eb81;
    Typelib::getTypename((string *)&local_380);
    anon_unknown.dwarf_19656::stripLeadingUnderscore(&local_3a0,&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
    iVar4 = Typelib::Type::getCategory();
    if (iVar4 == 1) {
      lVar8 = __dynamic_cast(*(undefined8 *)(*(long *)(type + 8) + 0x40),&Typelib::Type::typeinfo,
                             &Typelib::Array::typeinfo,0);
      if (lVar8 == 0) {
        __cxa_bad_cast();
      }
      pTVar9 = (Type *)Typelib::Indirect::getIndirection();
      getIDLAbsolute_abi_cxx11_(&local_380,this,pTVar9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,local_380._M_dataplus._M_p,
                           local_380._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
      Typelib::Array::getDimension();
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"];",2);
LAB_0010eefa:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p);
      }
    }
    else {
      iVar4 = Typelib::Type::getCategory();
      if (iVar4 == 7) {
        Typelib::Type::getName_abi_cxx11_();
        iVar4 = std::__cxx11::string::compare((char *)&local_380);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p);
        }
        if (iVar4 != 0) {
          lVar8 = __dynamic_cast(*(undefined8 *)(*(long *)(type + 8) + 0x40),
                                 &Typelib::Type::typeinfo,&Typelib::Container::typeinfo,0);
          if (lVar8 == 0) {
            __cxa_bad_cast();
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"sequence<",9);
          pTVar9 = (Type *)Typelib::Indirect::getIndirection();
          getIDLAbsolute_abi_cxx11_(&local_380,this,pTVar9);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_200,local_380._M_dataplus._M_p,
                               local_380._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"> ",2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
          goto LAB_0010eefa;
        }
      }
      iVar4 = Typelib::Type::getCategory();
      if (iVar4 == 6) {
        if (this->m_opaque_as_any == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"any ",4);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_200,local_3a0._M_dataplus._M_p,
                               local_3a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
        }
      }
      else {
        Typelib::getTypename((string *)&local_380);
        lVar8 = std::__cxx11::string::find_first_of((char *)&local_380,0x1180ea,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p);
        }
        if (lVar8 == -1) {
          getIDLAbsolute_abi_cxx11_(&local_380,this,*(Type **)(*(long *)(type + 8) + 0x40));
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_200,local_380._M_dataplus._M_p,
                               local_380._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,";",1);
          goto LAB_0010eefa;
        }
      }
    }
    std::__cxx11::stringbuf::str();
    if ((string *)local_380._M_string_length != (string *)0x0) {
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->m_typedefs,&local_360);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,&local_380);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    bVar2 = true;
  }
  else {
    cVar3 = Typelib::Type::operator!=
                      (*(Type **)(iVar7._M_node + 2),*(Type **)(*(long *)(type + 8) + 0x40));
    if (cVar3 != '\0') {
      this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
      lVar8 = *(long *)(type + 8);
      pTVar9 = *(Type **)(lVar8 + 0x40);
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_320,*(long *)(lVar8 + 0x20),
                 *(long *)(lVar8 + 0x28) + *(long *)(lVar8 + 0x20));
      std::operator+(&local_380,"the typedef name ",&local_320);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_380);
      local_3a0._M_dataplus._M_p = (pointer)*plVar6;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p == paVar13) {
        local_3a0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_3a0.field_2._8_8_ = plVar6[3];
        local_3a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3a0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_3a0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      Typelib::UnsupportedType::UnsupportedType(this_00,pTVar9,&local_3a0);
      __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,
                  Typelib::UnsupportedType::~UnsupportedType);
    }
LAB_0010eb81:
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  this_02 = (ios_base *)(local_200 + 0x70);
LAB_0010ebae:
  std::ios_base::~ios_base(this_02);
  return bVar2;
}

Assistant:

bool IDLExport::save
    ( ostream& stream
    , Typelib::RegistryIterator const& type )
{
    if (! m_selected_types.empty())
    {
        if (m_selected_types.count(type->getName()) == 0)
        {
            return false;
        }
    }

    if (type.isAlias())
    {
        // IDL has C++-like rules for struct and enums. Do not alias a "struct A" to "A";
        if (type->getNamespace() != type.getNamespace()
                || (type->getBasename() != "struct " + type.getBasename()
                    && type->getBasename() != "enum " + type.getBasename()
                    && type.getBasename() != "struct " + type->getBasename()
                    && type.getBasename() != "enum " + type->getBasename()))
        {
            IDLExport::checkType(*type);
            ostringstream stream;

            std::string type_namespace = getIDLAbsoluteNamespace(type.getNamespace(), *this);

            map<string, Type const*>::const_iterator already_exported =
                m_exported_typedefs.find(type.getName());
            if (already_exported != m_exported_typedefs.end())
            {
                if (*already_exported->second != *type)
                    throw UnsupportedType(*type, "the typedef name " + type.getName() + " is reserved by the IDL exporter");
                return false;
            }
            else if (type.getBasename().find_first_of("/<>") != std::string::npos)
            {
                return false;
            }

            std::string base_name = stripLeadingUnderscore(type.getBasename());

            // Alias types using typedef, taking into account that the aliased type
            // may not be in the same module than the new alias.
            if (type->getCategory() == Type::Array)
            {
                Array const& array_t = dynamic_cast<Array const&>(*type);
                stream
                    << getIDLAbsolute(array_t.getIndirection())
                    << " " << base_name << "[" << array_t.getDimension() << "];";
            }
            else if (type->getCategory() == Type::Container && type->getName() != "/std/string")
            {
                // Generate a sequence, regardless of the actual container type
                Container const& container_t = dynamic_cast<Container const&>(*type);
                stream << "sequence<" << getIDLAbsolute(container_t.getIndirection()) << "> " << base_name << ";";
            }
            else if (type->getCategory() == Type::Opaque)
            {
                if (marshalOpaquesAsAny())
                    stream << "any " << base_name << ";";
            }
            else if (type.getBasename().find_first_of(" ") == string::npos)
                stream << getIDLAbsolute(*type) << " " << base_name << ";";

            std::string def = stream.str();
            if (!def.empty())
                m_typedefs[type_namespace].push_back(def);
            return true;
        }
        else return false;
    }
    else
    {
        // Don't call adaptNamespace right now, since some types can be simply
        // ignored by the IDLExportVisitor -- resulting in an empty module,
        // which is not accepted in IDL
        //
        // Instead, act "as if" the namespace was changed, capturing the output
        // in a temporary ostringstream and change namespace only if some output
        // has actually been generated

        if (m_blob_threshold && static_cast<int>(type->getSize()) > m_blob_threshold)
        {
            string target_namespace = getIDLAbsoluteNamespace(type.getNamespace(), *this);
            size_t ns_size = namespaceIndentLevel(target_namespace);
            string indent_string = string(ns_size * 4, ' ');

            adaptNamespace(stream, target_namespace);
            stream << indent_string << "typedef sequence<octet> " << type->getBasename() << ";\n";
            return true;
        }
        else
        {
            IDLExportVisitor exporter(type.getRegistry(), *this, m_exported_typedefs);
            exporter.apply(*type);

            string result = exporter.getResult();
            if (result.empty())
                return false;
            else
            {
                adaptNamespace(stream, exporter.getTargetNamespace());
                stream << result;
                return true;
            }
        }
    }
}